

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O0

Pattern * __thiscall CombinePattern::doOr(CombinePattern *this,Pattern *b,int4 sa)

{
  int iVar1;
  undefined4 extraout_var;
  DisjointPattern *a;
  DisjointPattern *b_00;
  OrPattern *tmp;
  DisjointPattern *res2;
  DisjointPattern *res1;
  int4 sa_local;
  Pattern *b_local;
  CombinePattern *this_local;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar1 = (*b->_vptr_Pattern[8])();
  if (iVar1 == 0) {
    iVar1 = (*(this->super_DisjointPattern).super_Pattern._vptr_Pattern[2])();
    a = (DisjointPattern *)CONCAT44(extraout_var_00,iVar1);
    iVar1 = (*b->_vptr_Pattern[2])();
    b_00 = (DisjointPattern *)CONCAT44(extraout_var_01,iVar1);
    if (sa < 0) {
      (*(a->super_Pattern)._vptr_Pattern[3])(a,(ulong)(uint)-sa);
    }
    else {
      (*(b_00->super_Pattern)._vptr_Pattern[3])(b_00,(ulong)(uint)sa);
    }
    this_local = (CombinePattern *)operator_new(0x20);
    OrPattern::OrPattern((OrPattern *)this_local,a,b_00);
  }
  else {
    iVar1 = (*b->_vptr_Pattern[4])(b,this,(ulong)(uint)-sa);
    this_local = (CombinePattern *)CONCAT44(extraout_var,iVar1);
  }
  return (Pattern *)this_local;
}

Assistant:

Pattern *CombinePattern::doOr(const Pattern *b,int4 sa) const

{
  if (b->numDisjoint() != 0)
    return b->doOr(this,-sa);

  DisjointPattern *res1 = (DisjointPattern *)simplifyClone();
  DisjointPattern *res2 = (DisjointPattern *)b->simplifyClone();
  if (sa < 0)
    res1->shiftInstruction(-sa);
  else
    res2->shiftInstruction(sa);
  OrPattern *tmp = new OrPattern(res1,res2);
  return tmp;
}